

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cpp
# Opt level: O2

bool __thiscall
Volume::Intersect(Volume *this,Ray *ray,float t_min,float t_max,hit_record_t *hit_record)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  hit_record_t _hit_record_1;
  hit_record_t _hit_record_2;
  float local_90 [13];
  Ray local_5c [2];
  
  iVar4 = (*this->m_object->_vptr_Object[2])(0xff7fffff,0x7f7fffff,this->m_object,ray,local_90);
  if (((char)iVar4 != '\0') &&
     (iVar4 = (*this->m_object->_vptr_Object[2])
                        ((ulong)(uint)(local_90[0] + 0.0001),0x7f7fffff,this->m_object,ray,
                         &local_5c[0].m_direction), (char)iVar4 != '\0')) {
    if (t_min <= local_90[0]) {
      t_min = local_90[0];
    }
    if (local_5c[0].m_direction.e[0] <= t_max) {
      t_max = local_5c[0].m_direction.e[0];
    }
    if (t_min < t_max) {
      fVar6 = (ray->m_direction).e[0];
      fVar1 = (ray->m_direction).e[1];
      fVar2 = (ray->m_direction).e[2];
      fVar3 = this->m_density;
      local_90[0] = t_min;
      local_5c[0].m_direction.e[0] = t_max;
      dVar7 = drand48();
      fVar5 = logf((float)dVar7);
      fVar5 = fVar5 * (-1.0 / fVar3);
      if (fVar5 < SQRT(fVar2 * fVar2 + fVar6 * fVar6 + fVar1 * fVar1) * (t_max - t_min)) {
        fVar6 = (ray->m_direction).e[0];
        fVar1 = (ray->m_direction).e[1];
        fVar2 = (ray->m_direction).e[2];
        fVar6 = fVar5 / SQRT(fVar2 * fVar2 + fVar6 * fVar6 + fVar1 * fVar1) + local_90[0];
        hit_record->m_t = fVar6;
        Ray::GetPoint(local_5c,fVar6);
        (hit_record->m_point).e[2] = local_5c[0].m_origin.e[2];
        *(undefined8 *)(hit_record->m_point).e = local_5c[0].m_origin.e._0_8_;
        (hit_record->m_normal).e[0] = 1.0;
        (hit_record->m_normal).e[1] = 0.0;
        (hit_record->m_normal).e[2] = 0.0;
        hit_record->m_material = this->m_material;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool
Volume::Intersect(const Ray& ray, float t_min, float t_max, hit_record_t& hit_record) const
{
	hit_record_t _hit_record_1, _hit_record_2;
	if(m_object->Intersect(ray, -std::numeric_limits<float>::max(), std::numeric_limits<float>::max(), _hit_record_1) &&
	   m_object->Intersect(ray,     _hit_record_1.m_t + RT_RAY_STEP, std::numeric_limits<float>::max(), _hit_record_2)
	  ) {

		_hit_record_1.m_t = std::max(_hit_record_1.m_t, t_min);
		_hit_record_2.m_t = std::min(_hit_record_2.m_t, t_max);
		if(_hit_record_1.m_t >= _hit_record_2.m_t) {
			return false;
		}

		float _distance_in_object = (_hit_record_2.m_t - _hit_record_1.m_t)*ray.GetDirection().length();
		float _hit_distance		  = -(1.0f / m_density)*std::log(RANDOM_GEN());
		if(_hit_distance < _distance_in_object) {
			hit_record.m_t        = _hit_record_1.m_t + _hit_distance/ray.GetDirection().length();
			hit_record.m_point    = ray.GetPoint(hit_record.m_t);
			hit_record.m_normal   = Vec3(1.0f,0.0f,0.0f);
			hit_record.m_material = m_material;
			return true;
		}
	}

    return false;
}